

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
::LookupBucketFor<unsigned_long>
          (DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
           *this,unsigned_long *Val,DenseSetPair<unsigned_long> **FoundBucket)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  DenseSetPair<unsigned_long> *pDVar5;
  uint uVar6;
  ulong uVar7;
  DenseSetPair<unsigned_long> *pDVar8;
  int iVar9;
  
  if (*(int *)(this + 0x10) == 0) {
    pDVar5 = (DenseSetPair<unsigned_long> *)0x0;
LAB_00d5f389:
    bVar2 = false;
  }
  else {
    uVar1 = *Val;
    if (0xfffffffffffffffd < uVar1) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x252,
                    "bool llvm::DenseMapBase<llvm::DenseMap<unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>, unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>, KeyT = unsigned long, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseSetPair<unsigned long>, LookupKeyT = unsigned long]"
                   );
    }
    uVar3 = *(int *)(this + 0x10) - 1;
    uVar7 = (ulong)((int)uVar1 * 0x25 & uVar3);
    pDVar5 = (DenseSetPair<unsigned_long> *)(*(long *)this + uVar7 * 8);
    uVar4 = pDVar5->key;
    bVar2 = true;
    if (uVar1 != uVar4) {
      iVar9 = 1;
      pDVar8 = (DenseSetPair<unsigned_long> *)0x0;
      do {
        if (uVar4 == 0xffffffffffffffff) {
          if (pDVar8 != (DenseSetPair<unsigned_long> *)0x0) {
            pDVar5 = pDVar8;
          }
          goto LAB_00d5f389;
        }
        if (uVar4 == 0xfffffffffffffffe && pDVar8 == (DenseSetPair<unsigned_long> *)0x0) {
          pDVar8 = pDVar5;
        }
        uVar6 = (int)uVar7 + iVar9;
        iVar9 = iVar9 + 1;
        uVar7 = (ulong)(uVar6 & uVar3);
        pDVar5 = (DenseSetPair<unsigned_long> *)(*(long *)this + uVar7 * 8);
        uVar4 = pDVar5->key;
      } while (uVar1 != uVar4);
    }
  }
  *FoundBucket = pDVar5;
  return bVar2;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }